

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,Twine *message)

{
  undefined8 local_68;
  undefined4 local_60;
  Twine local_58;
  string local_40;
  
  local_68 = 0;
  local_60 = 0;
  llvm::Twine::str_abi_cxx11_(&local_40,message);
  llvm::Twine::Twine(&local_58,&local_40);
  (*(this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate[3])(this,"",0,&local_68,&local_58);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(const Twine& message) {
  error("", {}, message.str());
}